

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deploymentinfo.cpp
# Opt level: O0

string * DeploymentName_abi_cxx11_(BuriedDeployment dep)

{
  bool bVar1;
  allocator<char> *__a;
  short in_SI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  BuriedDeployment in_stack_ffffffffffffff7e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar1 = Consensus::ValidDeployment(in_stack_ffffffffffffff7e);
  if (!bVar1) {
    __assert_fail("ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentinfo.cpp"
                  ,0x18,"std::string DeploymentName(Consensus::BuriedDeployment)");
  }
  __a = (allocator<char> *)(ulong)((int)in_SI + 0x8000);
  switch(__a) {
  case (allocator<char> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_9);
    break;
  case (allocator<char> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_a);
    break;
  case (allocator<char> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_b);
    break;
  case (allocator<char> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_c);
    break;
  case (allocator<char> *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

std::string DeploymentName(Consensus::BuriedDeployment dep)
{
    assert(ValidDeployment(dep));
    switch (dep) {
    case Consensus::DEPLOYMENT_HEIGHTINCB:
        return "bip34";
    case Consensus::DEPLOYMENT_CLTV:
        return "bip65";
    case Consensus::DEPLOYMENT_DERSIG:
        return "bip66";
    case Consensus::DEPLOYMENT_CSV:
        return "csv";
    case Consensus::DEPLOYMENT_SEGWIT:
        return "segwit";
    } // no default case, so the compiler can warn about missing cases
    return "";
}